

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void LTACMasterdataChannel::RegisterMasterDataChn(LTACMasterdataChannel *pChn,bool bToFrontOfQueue)

{
  bool bVar1;
  byte in_SIL;
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff90;
  value_type *in_stack_ffffffffffffff98;
  list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *__last;
  _List_iterator<LTACMasterdataChannel_*> in_stack_ffffffffffffffa8;
  _Self local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  _Self local_30 [4];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __last = &lstChn_abi_cxx11_;
  local_38 = (_List_node_base *)
             std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
             begin((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                   in_stack_ffffffffffffff88);
  local_40 = (_List_node_base *)
             std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
             end((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                 in_stack_ffffffffffffff88);
  local_30[0]._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<LTACMasterdataChannel*>,LTACMasterdataChannel*>
                 (in_stack_ffffffffffffffa8,(_List_iterator<LTACMasterdataChannel_*>)__last,
                  in_stack_ffffffffffffff98);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::end
                 ((list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
                  in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_30,&local_48);
  if (bVar1) {
    if ((local_9 & 1) == 0) {
      std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
      push_back(__last,in_stack_ffffffffffffff98);
    }
    else {
      std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::
      push_front(__last,in_stack_ffffffffffffff98);
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c558f);
  return;
}

Assistant:

void LTACMasterdataChannel::RegisterMasterDataChn (LTACMasterdataChannel* pChn,
                                                   bool bToFrontOfQueue)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just add the channel to the list of channels
        if (std::find(lstChn.begin(), lstChn.end(), pChn) == lstChn.end()) {
            if (bToFrontOfQueue)
                lstChn.push_front(pChn);
            else
                lstChn.push_back(pChn);
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}